

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O0

bool decodeOutString(DAG *_dag,
                    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *out,Unicode *_unicode)

{
  size_type sVar1;
  reference pvVar2;
  string *in_RDX;
  vector<DAG_node,_std::allocator<DAG_node>_> *in_RDI;
  string temp;
  iterator begin;
  int j;
  int i;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffff78;
  value_type *__x;
  const_iterator in_stack_ffffffffffffff88;
  const_iterator in_stack_ffffffffffffff90;
  string local_48 [32];
  unsigned_short *local_28;
  int local_20;
  int local_1c;
  vector<DAG_node,_std::allocator<DAG_node>_> *local_8;
  
  local_8 = in_RDI;
  sVar1 = std::vector<DAG_node,_std::allocator<DAG_node>_>::size(in_RDI);
  local_20 = (int)sVar1 + -1;
  local_28 = (unsigned_short *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       (in_stack_ffffffffffffff78);
  std::__cxx11::string::string(local_48);
  while (0 < local_20) {
    pvVar2 = std::vector<DAG_node,_std::allocator<DAG_node>_>::operator[](local_8,(long)local_20);
    local_1c = pvVar2->prev;
    __x = (value_type *)&local_28;
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator+((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                 *)in_stack_ffffffffffffff88._M_current,(difference_type)in_RDX);
    __gnu_cxx::
    __normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
    ::__normal_iterator<unsigned_short*>
              ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                *)in_RDX,
               (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                *)__x);
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator+((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                 *)in_stack_ffffffffffffff88._M_current,(difference_type)in_RDX);
    __gnu_cxx::
    __normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
    ::__normal_iterator<unsigned_short*>
              ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                *)in_RDX,
               (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                *)__x);
    CppJieba::TransCode::encode(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_RDX);
    local_20 = local_1c;
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)in_RDX,__x);
  }
  std::__cxx11::string::~string(local_48);
  return true;
}

Assistant:

bool decodeOutString(DAG &_dag, stack<string> &out, Unicode _unicode)
{
	int i, j = _dag.size()-1;
	auto begin = _unicode.begin();
	string temp;
	while (j > 0) {
	     i = _dag[j].prev;
	     encode(begin+i, begin+j, temp);
	     j = i;
	     out.push(temp);
	}
    return true;
}